

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio.c
# Opt level: O0

int fbackupfile(char *fn)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  char *bkpth;
  char *tname;
  char *nname;
  char buf [8192];
  size_t local_e0;
  ssize_t nread;
  int serrno;
  int to;
  int from;
  timespec new_times [2];
  stat sb;
  char *fn_local;
  
  iVar2 = stat(fn,(stat *)&new_times[1].tv_nsec);
  if (iVar2 == -1) {
    dobeep();
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    ewprintf("Can\'t stat %s : %s",fn,pcVar5);
    fn_local._4_4_ = 0;
  }
  else {
    pcVar5 = bkuplocation(fn);
    if (pcVar5 == (char *)0x0) {
      fn_local._4_4_ = 0;
    }
    else {
      iVar2 = asprintf(&tname,"%s~",pcVar5);
      if (iVar2 == -1) {
        dobeep();
        piVar4 = __errno_location();
        pcVar6 = strerror(*piVar4);
        ewprintf("Can\'t allocate backup file name : %s",pcVar6);
        free(pcVar5);
        fn_local._4_4_ = 2;
      }
      else {
        iVar2 = asprintf(&bkpth,"%s.XXXXXXXXXX",pcVar5);
        if (iVar2 == -1) {
          dobeep();
          piVar4 = __errno_location();
          pcVar6 = strerror(*piVar4);
          ewprintf("Can\'t allocate temp file name : %s",pcVar6);
          free(pcVar5);
          free(tname);
          fn_local._4_4_ = 2;
        }
        else {
          free(pcVar5);
          iVar2 = open(fn,0);
          if (iVar2 == -1) {
            free(tname);
            free(bkpth);
            fn_local._4_4_ = 0;
          }
          else {
            iVar3 = mkstemp(bkpth);
            if (iVar3 == -1) {
              piVar4 = __errno_location();
              iVar3 = *piVar4;
              close(iVar2);
              free(tname);
              free(bkpth);
              piVar4 = __errno_location();
              *piVar4 = iVar3;
              fn_local._4_4_ = 0;
            }
            else {
              do {
                local_e0 = read(iVar2,&nname,0x2000);
                if ((long)local_e0 < 1) goto LAB_00114d37;
                sVar7 = write(iVar3,&nname,local_e0);
              } while (sVar7 == local_e0);
              local_e0 = 0xffffffffffffffff;
LAB_00114d37:
              piVar4 = __errno_location();
              iVar1 = *piVar4;
              fchmod(iVar3,(uint)sb.st_nlink & 0x1ff);
              futimens(iVar3,(timespec *)&to);
              close(iVar2);
              close(iVar3);
              if (local_e0 == 0xffffffffffffffff) {
                iVar2 = unlink(bkpth);
                if (iVar2 == -1) {
                  piVar4 = __errno_location();
                  pcVar5 = strerror(*piVar4);
                  ewprintf("Can\'t unlink temp : %s",pcVar5);
                }
              }
              else {
                iVar2 = rename(bkpth,tname);
                if (iVar2 == -1) {
                  piVar4 = __errno_location();
                  pcVar5 = strerror(*piVar4);
                  ewprintf("Can\'t rename temp : %s",pcVar5);
                  unlink(bkpth);
                  local_e0 = 0xffffffffffffffff;
                }
              }
              free(tname);
              free(bkpth);
              piVar4 = __errno_location();
              *piVar4 = iVar1;
              fn_local._4_4_ = (uint)(local_e0 != 0xffffffffffffffff);
            }
          }
        }
      }
    }
  }
  return fn_local._4_4_;
}

Assistant:

int
fbackupfile(const char *fn)
{
	struct stat	 sb;
	struct timespec	 new_times[2];
	int		 from, to, serrno;
	ssize_t		 nread;
	char		 buf[BUFSIZ];
	char		*nname, *tname, *bkpth;

	if (stat(fn, &sb) == -1) {
		dobeep();
		ewprintf("Can't stat %s : %s", fn, strerror(errno));
		return (FALSE);
	}

	if ((bkpth = bkuplocation(fn)) == NULL)
		return (FALSE);

	if (asprintf(&nname, "%s~", bkpth) == -1) {
		dobeep();
		ewprintf("Can't allocate backup file name : %s", strerror(errno));
		free(bkpth);
		return (ABORT);
	}
	if (asprintf(&tname, "%s.XXXXXXXXXX", bkpth) == -1) {
		dobeep();
		ewprintf("Can't allocate temp file name : %s", strerror(errno));
		free(bkpth);
		free(nname);
		return (ABORT);
	}
	free(bkpth);

	if ((from = open(fn, O_RDONLY)) == -1) {
		free(nname);
		free(tname);
		return (FALSE);
	}
	to = mkstemp(tname);
	if (to == -1) {
		serrno = errno;
		close(from);
		free(nname);
		free(tname);
		errno = serrno;
		return (FALSE);
	}
	while ((nread = read(from, buf, sizeof(buf))) > 0) {
		if (write(to, buf, (size_t)nread) != nread) {
			nread = -1;
			break;
		}
	}
	serrno = errno;
	(void) fchmod(to, (sb.st_mode & 0777));

	/* copy the mtime to the backupfile */
	new_times[0] = sb.st_atim;
	new_times[1] = sb.st_mtim;
	futimens(to, new_times);

	close(from);
	close(to);
	if (nread == -1) {
		if (unlink(tname) == -1)
			ewprintf("Can't unlink temp : %s", strerror(errno));
	} else {
		if (rename(tname, nname) == -1) {
			ewprintf("Can't rename temp : %s", strerror(errno));
			(void) unlink(tname);
			nread = -1;
		}
	}
	free(nname);
	free(tname);
	errno = serrno;

	return (nread == -1 ? FALSE : TRUE);
}